

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O0

int __thiscall
axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::copy
          (Array<char,_axl::sl::ArrayDetails<char>_> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  bool bVar1;
  bool result;
  char *end;
  Ptr<void> shadow;
  size_t in_stack_ffffffffffffff98;
  undefined6 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  void *in_stack_ffffffffffffffb8;
  BufHdr *in_stack_ffffffffffffffc0;
  EVP_PKEY_CTX *local_8;
  
  if (src == (EVP_PKEY_CTX *)0x0) {
    clear((Array<char,_axl::sl::ArrayDetails<char>_> *)0x13c7ef);
    local_8._0_4_ = 0;
  }
  else {
    rc::Ptr<void>::Ptr((Ptr<void> *)0x13c807);
    local_8 = src;
    if (((this->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_hdr == (Hdr *)0x0) ||
       (in_stack_ffffffffffffffa7 =
             rc::BufHdr::isInsideBuffer(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8),
       !(bool)in_stack_ffffffffffffffa7)) {
      bVar1 = setCount((Array<char,_axl::sl::ArrayDetails<char>_> *)
                       CONCAT17(in_stack_ffffffffffffffa7,
                                CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)),
                       in_stack_ffffffffffffff98);
      if (bVar1) {
        SimpleArrayDetails<char>::copy
                  ((SimpleArrayDetails<char> *)
                   (this->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_p,dst,src);
      }
      else {
        local_8 = (EVP_PKEY_CTX *)0xffffffffffffffff;
      }
    }
    else {
      rc::BufHdr::getEnd((this->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_hdr);
      (this->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_p = (char *)dst;
      (this->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_count = (size_t)src;
    }
    rc::Ptr<void>::~Ptr((Ptr<void> *)0x13c8fc);
  }
  return (int)local_8;
}

Assistant:

size_t
	copy(
		const T* p,
		size_t count
	) {
		if (count == 0) {
			clear();
			return 0;
		}

		rc::Ptr<void> shadow;
		if (this->m_hdr && this->m_hdr->isInsideBuffer(p))
			if (Details::IsSimple) {
				// for simple non-ctor-dtor types we can apply in-buffer shift

				T* end = (T*)this->m_hdr->getEnd();
				ASSERT(p + count <= end);

				this->m_p = (T*)p;
				this->m_count = count;
				return count;
			} else {
				shadow = this->m_hdr; // ensure we keep p intact
			}

		bool result = setCount(count);
		if (!result)
			return -1;

		Details::copy(this->m_p, p, count);
		return count;
	}